

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.cpp
# Opt level: O3

void __thiscall
duckdb::roaring::CompressedRunContainerScanState::LoadNextRun(CompressedRunContainerScanState *this)

{
  ulong uVar1;
  data_ptr_t pdVar2;
  ushort uVar3;
  byte bVar4;
  uint8_t uVar5;
  uint uVar6;
  ulong uVar7;
  byte bVar8;
  uint8_t *puVar9;
  ulong uVar10;
  
  uVar1 = (this->super_RunContainerScanState).run_index;
  if ((this->super_RunContainerScanState).count <= uVar1) {
    (this->super_RunContainerScanState).finished = true;
    return;
  }
  uVar10 = (ulong)(this->segment).index;
  bVar8 = (this->segment).count;
  if ((uVar10 < 8) && (puVar9 = (this->segment).segments, puVar9[uVar10] <= bVar8)) {
    puVar9 = puVar9 + uVar10;
    uVar7 = uVar10;
    do {
      puVar9 = puVar9 + 1;
      (this->segment).count = '\0';
      uVar6 = (int)uVar7 + 1;
      uVar10 = (ulong)uVar6;
      (this->segment).index = (uint8_t)uVar6;
      if ((char)uVar7 == '\a') {
        uVar10 = 8;
        break;
      }
      uVar7 = uVar10;
    } while (*puVar9 == '\0');
    bVar8 = 0;
  }
  bVar8 = bVar8 + 1;
  (this->segment).count = bVar8;
  bVar4 = (byte)uVar10;
  pdVar2 = (this->super_RunContainerScanState).data;
  uVar3 = (ushort)pdVar2[uVar1 * 2] | (ushort)(((uint)uVar10 & 0xff) << 8);
  if (bVar4 < 8) {
    uVar10 = uVar10 & 0xff;
    uVar5 = bVar4 + 1;
    do {
      if (bVar8 < (this->segment).segments[uVar10]) {
        bVar4 = (byte)uVar10;
        goto LAB_0056761f;
      }
      (this->segment).count = '\0';
      uVar10 = uVar10 + 1;
      (this->segment).index = uVar5;
      uVar5 = uVar5 + '\x01';
      bVar8 = 0;
    } while (uVar5 != '\t');
    bVar4 = 8;
  }
LAB_0056761f:
  (this->segment).count = bVar8 + 1;
  bVar8 = pdVar2[uVar1 * 2 + 1];
  (this->super_RunContainerScanState).run.start = uVar3;
  (this->super_RunContainerScanState).run.length = ~uVar3 + (ushort)bVar4 * 0x100 + (ushort)bVar8;
  (this->super_RunContainerScanState).run_index = uVar1 + 1;
  return;
}

Assistant:

void CompressedRunContainerScanState::LoadNextRun() {
	if (run_index >= count) {
		finished = true;
		return;
	}
	uint16_t start = segment++;
	start += reinterpret_cast<uint8_t *>(data)[(run_index * 2) + 0];

	uint16_t end = segment++;
	end += reinterpret_cast<uint8_t *>(data)[(run_index * 2) + 1];

	D_ASSERT(end > start);
	run = RunContainerRLEPair {start, static_cast<uint16_t>(end - 1 - start)};
	run_index++;
}